

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day.h
# Opt level: O0

void __thiscall Day::print(Day *this)

{
  ostream *poVar1;
  size_type sVar2;
  reference this_00;
  ulong local_18;
  size_t i;
  Day *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"day: ");
  poVar1 = std::operator<<(poVar1,(string *)&this->name);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_18 = 0;
  while( true ) {
    sVar2 = std::vector<Lesson,_std::allocator<Lesson>_>::size(&this->lessons);
    if (sVar2 <= local_18) break;
    this_00 = std::vector<Lesson,_std::allocator<Lesson>_>::operator[](&this->lessons,local_18);
    Lesson::print(this_00);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void Day::print() {
    std::cout << "day: " << name << std::endl;
    for (size_t i = 0; i < lessons.size(); i++) {
        lessons[i].print();
        std::cout << std::endl;
    }
}